

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintPI(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  byte bVar1;
  uint uVar2;
  ulong in_RAX;
  uint c_00;
  byte *str;
  tchar c;
  undefined8 uStack_38;
  
  pprint = &doc->pprint;
  uVar2 = (doc->pprint).linelen;
  if ((ulong)(uVar2 + indent) < (doc->config).value[0x5d].v) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar2;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  uStack_38 = in_RAX;
  AddString(pprint,"<?");
  str = (byte *)node->element;
  if ((str != (byte *)0x0) && (bVar1 = *str, bVar1 != 0)) {
    do {
      uStack_38 = (ulong)CONCAT14(bVar1,(undefined4)uStack_38);
      c_00 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar2 = prvTidyGetUTF8((ctmbstr)str,(uint *)((long)&uStack_38 + 4));
        str = str + uVar2;
        c_00 = uStack_38._4_4_;
      }
      AddChar(pprint,c_00);
      bVar1 = str[1];
      str = str + 1;
    } while (bVar1 != 0);
  }
  PPrintText(doc,0x10,indent,node);
  if (((*(int *)((doc->config).value + 100) != 0) || (*(int *)((doc->config).value + 0x62) != 0)) ||
     (node->closed != no)) {
    AddChar(pprint,0x3f);
  }
  AddChar(pprint,0x3e);
  PCondFlushLine(doc,indent);
  return;
}

Assistant:

static void PPrintPI( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    tchar c;
    tmbstr s;

    SetWrap( doc, indent );
    AddString( pprint, "<?" );

    s = node->element;

    while (s && *s)
    {
        c = (unsigned char)*s;
        if (c > 0x7F)
            s += TY_(GetUTF8)(s, &c);
        AddChar(pprint, c);
        ++s;
    }

    /* set CDATA to pass < and > unescaped */
    PPrintText( doc, CDATA, indent, node );

    if (cfgBool(doc, TidyXmlOut) ||
        cfgBool(doc, TidyXhtmlOut) || node->closed)
        AddChar( pprint, '?' );

    AddChar( pprint, '>' );
    PCondFlushLine( doc, indent );
}